

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

ostream * nivalis::operator<<(ostream *os,ASTNode *node)

{
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  if (node->opcode == 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"#",1);
    std::ostream::_M_insert<double>((node->field_1).val);
  }
  if ((node->opcode < 0x13) && ((0x6000cU >> (node->opcode & 0x1f) & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"&",1);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Expr::ASTNode& node) {
    os << node.opcode;
    if (node.opcode == OpCode::val) os << "#" << node.val;
    if (OpCode::has_ref(node.opcode)) os << "&" << node.ref;
    return os;
}